

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t,secp256k1_fe *x_in,secp256k1_fe *u_in,int c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  int iVar760;
  ulong uVar761;
  ulong uVar762;
  ulong uVar763;
  ulong uVar764;
  ulong uVar765;
  ulong uVar766;
  secp256k1_fe *psVar767;
  ulong uVar768;
  ulong uVar769;
  ulong uVar770;
  ulong uVar771;
  ulong uVar772;
  ulong uVar773;
  ulong uVar774;
  ulong uVar775;
  ulong uVar776;
  ulong uVar777;
  ulong uVar778;
  ulong uVar779;
  ulong uVar780;
  ulong uVar781;
  long lVar782;
  uint64_t tmp1_10;
  secp256k1_fe local_1a8;
  secp256k1_fe x;
  uint64_t tmp2;
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  ulong local_f8;
  secp256k1_fe *local_e8;
  uint64_t tmp3_6;
  uint64_t tmp2_10;
  secp256k1_fe r;
  secp256k1_fe local_a8;
  uint64_t tmp1;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  uint64_t tmp3_2;
  uint64_t uStack_50;
  uint64_t uStack_48;
  uint64_t local_40;
  uint64_t uStack_38;
  
  uVar761 = (x_in->n[4] >> 0x30) * 0x1000003d1 + x_in->n[0];
  uVar763 = (uVar761 >> 0x34) + x_in->n[1];
  x.n[0] = uVar761 & 0xfffffffffffff;
  uVar761 = (uVar763 >> 0x34) + x_in->n[2];
  uVar768 = (uVar761 >> 0x34) + x_in->n[3];
  x.n[1] = uVar763 & 0xfffffffffffff;
  x.n[2] = uVar761 & 0xfffffffffffff;
  x.n[4] = (uVar768 >> 0x34) + (x_in->n[4] & 0xffffffffffff);
  x.n[3] = uVar768 & 0xfffffffffffff;
  uVar768 = (u_in->n[4] >> 0x30) * 0x1000003d1 + u_in->n[0];
  uVar780 = (uVar768 >> 0x34) + u_in->n[1];
  uVar768 = uVar768 & 0xfffffffffffff;
  uVar781 = (uVar780 >> 0x34) + u_in->n[2];
  uVar780 = uVar780 & 0xfffffffffffff;
  uVar761 = (uVar781 >> 0x34) + u_in->n[3];
  uVar781 = uVar781 & 0xfffffffffffff;
  uVar763 = (uVar761 >> 0x34) + (u_in->n[4] & 0xffffffffffff);
  uVar761 = uVar761 & 0xfffffffffffff;
  local_e8 = t;
  if ((c & 2U) == 0) {
    local_1a8.n[0] = 0x5ffff9ffffe91a - (uVar768 + x.n[0]);
    local_1a8.n[1] = 0x5ffffffffffffa - (uVar780 + x.n[1]);
    local_1a8.n[2] = 0x5ffffffffffffa - (uVar781 + x.n[2]);
    local_1a8.n[3] = 0x5ffffffffffffa - (uVar761 + x.n[3]);
    local_1a8.n[4] = 0x5fffffffffffa - (uVar763 + x.n[4]);
    iVar760 = secp256k1_ge_x_on_curve_var(&local_1a8);
    if (iVar760 != 0) {
      return 0;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1a8.n[0] * 2;
    auVar361._8_8_ = 0;
    auVar361._0_8_ = local_1a8.n[3];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_1a8.n[1] * 2;
    auVar362._8_8_ = 0;
    auVar362._0_8_ = local_1a8.n[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_1a8.n[4];
    auVar363._8_8_ = 0;
    auVar363._0_8_ = local_1a8.n[4];
    uVar762 = SUB168(auVar3 * auVar363,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar2 * auVar362 + auVar1 * auVar361 + auVar4 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    auVar669._8_8_ = 0;
    auVar669._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    local_1a8.n[4] = local_1a8.n[4] * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_1a8.n[0];
    auVar364._8_8_ = 0;
    auVar364._0_8_ = local_1a8.n[4];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_1a8.n[1] * 2;
    auVar365._8_8_ = 0;
    auVar365._0_8_ = local_1a8.n[3];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1a8.n[2];
    auVar366._8_8_ = 0;
    auVar366._0_8_ = local_1a8.n[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar762 >> 0x34 | SUB168(auVar3 * auVar363,8) << 0xc;
    auVar162 = auVar5 * auVar364 + auVar669 + auVar6 * auVar365 + auVar7 * auVar366 +
               auVar8 * ZEXT816(0x1000003d10);
    uVar766 = auVar162._0_8_;
    auVar670._8_8_ = 0;
    auVar670._0_8_ = uVar766 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1a8.n[0];
    auVar367._8_8_ = 0;
    auVar367._0_8_ = local_1a8.n[0];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_1a8.n[1];
    auVar368._8_8_ = 0;
    auVar368._0_8_ = local_1a8.n[4];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_1a8.n[2] * 2;
    auVar369._8_8_ = 0;
    auVar369._0_8_ = local_1a8.n[3];
    auVar162 = auVar10 * auVar368 + auVar670 + auVar11 * auVar369;
    uVar762 = auVar162._0_8_;
    auVar672._8_8_ = 0;
    auVar672._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar370._8_8_ = 0;
    auVar370._0_8_ = (uVar762 & 0xfffffffffffff) << 4 | (uVar766 & 0xfffffffffffff) >> 0x30;
    auVar162 = auVar9 * auVar367 + ZEXT816(0x1000003d1) * auVar370;
    uVar769 = auVar162._0_8_;
    auVar671._8_8_ = 0;
    auVar671._0_8_ = uVar769 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_1a8.n[0] * 2;
    auVar371._8_8_ = 0;
    auVar371._0_8_ = local_1a8.n[1];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_1a8.n[2];
    auVar372._8_8_ = 0;
    auVar372._0_8_ = local_1a8.n[4];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_1a8.n[3];
    auVar373._8_8_ = 0;
    auVar373._0_8_ = local_1a8.n[3];
    auVar163 = auVar13 * auVar372 + auVar672 + auVar14 * auVar373;
    uVar762 = auVar163._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar12 * auVar371 + auVar671 + auVar15 * ZEXT816(0x1000003d10);
    uVar770 = auVar162._0_8_;
    auVar674._8_8_ = 0;
    auVar674._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar673._8_8_ = 0;
    auVar673._0_8_ = uVar770 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1a8.n[0] * 2;
    auVar374._8_8_ = 0;
    auVar374._0_8_ = local_1a8.n[2];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_1a8.n[1];
    auVar375._8_8_ = 0;
    auVar375._0_8_ = local_1a8.n[1];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_1a8.n[3];
    auVar376._8_8_ = 0;
    auVar376._0_8_ = local_1a8.n[4];
    auVar674 = auVar18 * auVar376 + auVar674;
    uVar762 = auVar674._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar16 * auVar374 + auVar673 + auVar17 * auVar375 + auVar19 * ZEXT816(0x1000003d10);
    uVar771 = auVar162._0_8_;
    auVar675._8_8_ = 0;
    auVar675._0_8_ = (uVar771 >> 0x34 | auVar162._8_8_ << 0xc) + (uVar765 & 0xfffffffffffff);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar762 >> 0x34 | auVar674._8_8_ << 0xc;
    auVar675 = auVar20 * ZEXT816(0x1000003d10) + auVar675;
    uVar772 = auVar675._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = x.n[0];
    auVar377._8_8_ = 0;
    auVar377._0_8_ = uVar761;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = x.n[1];
    auVar378._8_8_ = 0;
    auVar378._0_8_ = uVar781;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = x.n[2];
    auVar379._8_8_ = 0;
    auVar379._0_8_ = uVar780;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = x.n[3];
    auVar380._8_8_ = 0;
    auVar380._0_8_ = uVar768;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = x.n[4];
    auVar381._8_8_ = 0;
    auVar381._0_8_ = uVar763;
    uVar762 = SUB168(auVar25 * auVar381,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar22 * auVar378 + auVar21 * auVar377 + auVar23 * auVar379 + auVar24 * auVar380 +
               auVar26 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    auVar676._8_8_ = 0;
    auVar676._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = x.n[0];
    auVar382._8_8_ = 0;
    auVar382._0_8_ = uVar763;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = x.n[1];
    auVar383._8_8_ = 0;
    auVar383._0_8_ = uVar761;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = x.n[2];
    auVar384._8_8_ = 0;
    auVar384._0_8_ = uVar781;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = x.n[3];
    auVar385._8_8_ = 0;
    auVar385._0_8_ = uVar780;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = x.n[4];
    auVar386._8_8_ = 0;
    auVar386._0_8_ = uVar768;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar762 >> 0x34 | SUB168(auVar25 * auVar381,8) << 0xc;
    auVar162 = auVar27 * auVar382 + auVar676 + auVar28 * auVar383 + auVar29 * auVar384 +
               auVar30 * auVar385 + auVar31 * auVar386 + auVar32 * ZEXT816(0x1000003d10);
    uVar762 = auVar162._0_8_;
    auVar677._8_8_ = 0;
    auVar677._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = x.n[0];
    auVar387._8_8_ = 0;
    auVar387._0_8_ = uVar768;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = x.n[1];
    auVar388._8_8_ = 0;
    auVar388._0_8_ = uVar763;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = x.n[2];
    auVar389._8_8_ = 0;
    auVar389._0_8_ = uVar761;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = x.n[3];
    auVar390._8_8_ = 0;
    auVar390._0_8_ = uVar781;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = x.n[4];
    auVar391._8_8_ = 0;
    auVar391._0_8_ = uVar780;
    auVar162 = auVar34 * auVar388 + auVar677 + auVar35 * auVar389 + auVar36 * auVar390 +
               auVar37 * auVar391;
    uVar764 = auVar162._0_8_;
    auVar679._8_8_ = 0;
    auVar679._0_8_ = uVar764 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar392._8_8_ = 0;
    auVar392._0_8_ = (uVar764 & 0xfffffffffffff) << 4 | (uVar762 & 0xfffffffffffff) >> 0x30;
    auVar162 = auVar33 * auVar387 + ZEXT816(0x1000003d1) * auVar392;
    uVar773 = auVar162._0_8_;
    auVar678._8_8_ = 0;
    auVar678._0_8_ = uVar773 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = x.n[0];
    auVar393._8_8_ = 0;
    auVar393._0_8_ = uVar780;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = x.n[1];
    auVar394._8_8_ = 0;
    auVar394._0_8_ = uVar768;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = x.n[2];
    auVar395._8_8_ = 0;
    auVar395._0_8_ = uVar763;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = x.n[3];
    auVar396._8_8_ = 0;
    auVar396._0_8_ = uVar761;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = x.n[4];
    auVar397._8_8_ = 0;
    auVar397._0_8_ = uVar781;
    auVar163 = auVar40 * auVar395 + auVar679 + auVar41 * auVar396 + auVar42 * auVar397;
    uVar764 = auVar163._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar764 & 0xfffffffffffff;
    auVar162 = auVar38 * auVar393 + auVar678 + auVar39 * auVar394 + auVar43 * ZEXT816(0x1000003d10);
    uVar774 = auVar162._0_8_;
    auVar681._8_8_ = 0;
    auVar681._0_8_ = uVar764 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar680._8_8_ = 0;
    auVar680._0_8_ = uVar774 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = x.n[0];
    auVar398._8_8_ = 0;
    auVar398._0_8_ = uVar781;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = x.n[1];
    auVar399._8_8_ = 0;
    auVar399._0_8_ = uVar780;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = x.n[2];
    auVar400._8_8_ = 0;
    auVar400._0_8_ = uVar768;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = x.n[3];
    auVar401._8_8_ = 0;
    auVar401._0_8_ = uVar763;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = x.n[4];
    auVar402._8_8_ = 0;
    auVar402._0_8_ = uVar761;
    auVar163 = auVar47 * auVar401 + auVar681 + auVar48 * auVar402;
    uVar764 = auVar163._0_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar764 & 0xfffffffffffff;
    auVar162 = auVar44 * auVar398 + auVar680 + auVar45 * auVar399 + auVar46 * auVar400 +
               auVar49 * ZEXT816(0x1000003d10);
    uVar775 = auVar162._0_8_;
    auVar682._8_8_ = 0;
    auVar682._0_8_ = (uVar775 >> 0x34 | auVar162._8_8_ << 0xc) + (uVar765 & 0xfffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar764 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar682 = auVar50 * ZEXT816(0x1000003d10) + auVar682;
    uVar765 = auVar682._0_8_;
    local_a8.n[0] = (0x3ffffbfffff0bc - (uVar769 & 0xfffffffffffff)) + (uVar773 & 0xfffffffffffff);
    local_a8.n[1] = (0x3ffffffffffffc - (uVar770 & 0xfffffffffffff)) + (uVar774 & 0xfffffffffffff);
    local_a8.n[2] = (0x3ffffffffffffc - (uVar771 & 0xfffffffffffff)) + (uVar775 & 0xfffffffffffff);
    local_a8.n[3] = (0x3ffffffffffffc - (uVar772 & 0xfffffffffffff)) + (uVar765 & 0xfffffffffffff);
    local_a8.n[4] =
         (0x3fffffffffffc - ((uVar772 >> 0x34 | auVar675._8_8_ << 0xc) + (uVar766 & 0xffffffffffff))
         ) + (uVar765 >> 0x34 | auVar682._8_8_ << 0xc) + (uVar762 & 0xffffffffffff);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar768 * 2;
    auVar403._8_8_ = 0;
    auVar403._0_8_ = uVar761;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar780 * 2;
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar781;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar763;
    auVar405._8_8_ = 0;
    auVar405._0_8_ = uVar763;
    uVar765 = SUB168(auVar53 * auVar405,0);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar765 & 0xfffffffffffff;
    auVar162 = auVar52 * auVar404 + auVar51 * auVar403 + auVar54 * ZEXT816(0x1000003d10);
    uVar766 = auVar162._0_8_;
    auVar683._8_8_ = 0;
    auVar683._0_8_ = uVar766 >> 0x34 | auVar162._8_8_ << 0xc;
    uVar762 = uVar763 * 2;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar768;
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uVar762;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar780 * 2;
    auVar407._8_8_ = 0;
    auVar407._0_8_ = uVar761;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar781;
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar781;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar765 >> 0x34 | SUB168(auVar53 * auVar405,8) << 0xc;
    auVar162 = auVar55 * auVar406 + auVar683 + auVar56 * auVar407 + auVar57 * auVar408 +
               auVar58 * ZEXT816(0x1000003d10);
    uVar769 = auVar162._0_8_;
    auVar684._8_8_ = 0;
    auVar684._0_8_ = uVar769 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar768;
    auVar409._8_8_ = 0;
    auVar409._0_8_ = uVar768;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar780;
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uVar762;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar781 * 2;
    auVar411._8_8_ = 0;
    auVar411._0_8_ = uVar761;
    auVar162 = auVar60 * auVar410 + auVar684 + auVar61 * auVar411;
    uVar765 = auVar162._0_8_;
    auVar686._8_8_ = 0;
    auVar686._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar412._8_8_ = 0;
    auVar412._0_8_ = (uVar765 & 0xfffffffffffff) << 4 | (uVar769 & 0xfffffffffffff) >> 0x30;
    auVar162 = auVar59 * auVar409 + ZEXT816(0x1000003d1) * auVar412;
    uVar764 = auVar162._0_8_;
    uVar765 = uVar764 & 0xfffffffffffff;
    auVar685._8_8_ = 0;
    auVar685._0_8_ = uVar764 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar768 * 2;
    auVar413._8_8_ = 0;
    auVar413._0_8_ = uVar780;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar781;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = uVar762;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar761;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar761;
    auVar163 = auVar63 * auVar414 + auVar686 + auVar64 * auVar415;
    uVar764 = auVar163._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar764 & 0xfffffffffffff;
    auVar162 = auVar62 * auVar413 + auVar685 + auVar65 * ZEXT816(0x1000003d10);
    uVar770 = auVar162._0_8_;
    auVar688._8_8_ = 0;
    auVar688._0_8_ = uVar764 >> 0x34 | auVar163._8_8_ << 0xc;
    uVar764 = uVar770 & 0xfffffffffffff;
    auVar687._8_8_ = 0;
    auVar687._0_8_ = uVar770 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar768 * 2;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = uVar781;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar780;
    auVar417._8_8_ = 0;
    auVar417._0_8_ = uVar780;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar761;
    auVar418._8_8_ = 0;
    auVar418._0_8_ = uVar762;
    auVar688 = auVar68 * auVar418 + auVar688;
    uVar770 = auVar688._0_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar770 & 0xfffffffffffff;
    auVar162 = auVar66 * auVar416 + auVar687 + auVar67 * auVar417 + auVar69 * ZEXT816(0x1000003d10);
    uVar771 = auVar162._0_8_;
    uVar762 = uVar771 & 0xfffffffffffff;
    auVar689._8_8_ = 0;
    auVar689._0_8_ = (uVar771 >> 0x34 | auVar162._8_8_ << 0xc) + (uVar766 & 0xfffffffffffff);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar770 >> 0x34 | auVar688._8_8_ << 0xc;
    auVar689 = auVar70 * ZEXT816(0x1000003d10) + auVar689;
    uVar770 = auVar689._0_8_;
    uVar766 = uVar770 & 0xfffffffffffff;
    uVar772 = (uVar770 >> 0x34 | auVar689._8_8_ << 0xc) + (uVar769 & 0xffffffffffff);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar768;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar766;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar780;
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar762;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar781;
    auVar421._8_8_ = 0;
    auVar421._0_8_ = uVar764;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar761;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar765;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar763;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar772;
    uVar769 = SUB168(auVar75 * auVar423,0);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar769 & 0xfffffffffffff;
    auVar162 = auVar72 * auVar420 + auVar71 * auVar419 + auVar73 * auVar421 + auVar74 * auVar422 +
               auVar76 * ZEXT816(0x1000003d10);
    uVar770 = auVar162._0_8_;
    auVar690._8_8_ = 0;
    auVar690._0_8_ = uVar770 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar768;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar772;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar780;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = uVar766;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar781;
    auVar426._8_8_ = 0;
    auVar426._0_8_ = uVar762;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar761;
    auVar427._8_8_ = 0;
    auVar427._0_8_ = uVar764;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar763;
    auVar428._8_8_ = 0;
    auVar428._0_8_ = uVar765;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar769 >> 0x34 | SUB168(auVar75 * auVar423,8) << 0xc;
    auVar162 = auVar77 * auVar424 + auVar690 + auVar78 * auVar425 + auVar79 * auVar426 +
               auVar80 * auVar427 + auVar81 * auVar428 + auVar82 * ZEXT816(0x1000003d10);
    uVar769 = auVar162._0_8_;
    auVar691._8_8_ = 0;
    auVar691._0_8_ = uVar769 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar768;
    auVar429._8_8_ = 0;
    auVar429._0_8_ = uVar765;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar780;
    auVar430._8_8_ = 0;
    auVar430._0_8_ = uVar772;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar781;
    auVar431._8_8_ = 0;
    auVar431._0_8_ = uVar766;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar761;
    auVar432._8_8_ = 0;
    auVar432._0_8_ = uVar762;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar763;
    auVar433._8_8_ = 0;
    auVar433._0_8_ = uVar764;
    auVar162 = auVar84 * auVar430 + auVar691 + auVar85 * auVar431 + auVar86 * auVar432 +
               auVar87 * auVar433;
    uVar771 = auVar162._0_8_;
    auVar693._8_8_ = 0;
    auVar693._0_8_ = uVar771 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar434._8_8_ = 0;
    auVar434._0_8_ = (uVar771 & 0xfffffffffffff) << 4 | (uVar769 & 0xfffffffffffff) >> 0x30;
    auVar162 = auVar83 * auVar429 + ZEXT816(0x1000003d1) * auVar434;
    uVar773 = auVar162._0_8_;
    auVar692._8_8_ = 0;
    auVar692._0_8_ = uVar773 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar768;
    auVar435._8_8_ = 0;
    auVar435._0_8_ = uVar764;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar780;
    auVar436._8_8_ = 0;
    auVar436._0_8_ = uVar765;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar781;
    auVar437._8_8_ = 0;
    auVar437._0_8_ = uVar772;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar761;
    auVar438._8_8_ = 0;
    auVar438._0_8_ = uVar766;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar763;
    auVar439._8_8_ = 0;
    auVar439._0_8_ = uVar762;
    auVar163 = auVar90 * auVar437 + auVar693 + auVar91 * auVar438 + auVar92 * auVar439;
    uVar771 = auVar163._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar771 & 0xfffffffffffff;
    auVar162 = auVar88 * auVar435 + auVar692 + auVar89 * auVar436 + auVar93 * ZEXT816(0x1000003d10);
    uVar774 = auVar162._0_8_;
    auVar695._8_8_ = 0;
    auVar695._0_8_ = uVar771 >> 0x34 | auVar163._8_8_ << 0xc;
    local_78 = uVar774 & 0xfffffffffffff;
    auVar694._8_8_ = 0;
    auVar694._0_8_ = uVar774 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar768;
    auVar440._8_8_ = 0;
    auVar440._0_8_ = uVar762;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar780;
    auVar441._8_8_ = 0;
    auVar441._0_8_ = uVar764;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar781;
    auVar442._8_8_ = 0;
    auVar442._0_8_ = uVar765;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar761;
    auVar443._8_8_ = 0;
    auVar443._0_8_ = uVar772;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar763;
    auVar444._8_8_ = 0;
    auVar444._0_8_ = uVar766;
    auVar163 = auVar97 * auVar443 + auVar695 + auVar98 * auVar444;
    uVar762 = auVar163._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar94 * auVar440 + auVar694 + auVar95 * auVar441 + auVar96 * auVar442 +
               auVar99 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    uStack_70 = uVar765 & 0xfffffffffffff;
    auVar696._8_8_ = 0;
    auVar696._0_8_ = (uVar765 >> 0x34 | auVar162._8_8_ << 0xc) + (uVar770 & 0xfffffffffffff);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar696 = auVar100 * ZEXT816(0x1000003d10) + auVar696;
    uVar762 = auVar696._0_8_;
    local_68 = uVar762 & 0xfffffffffffff;
    uStack_60 = (uVar762 >> 0x34 | auVar696._8_8_ << 0xc) + (uVar769 & 0xffffffffffff);
    tmp1 = (uVar773 & 0xfffffffffffff) + 7;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = tmp1;
    auVar445._8_8_ = 0;
    auVar445._0_8_ = local_a8.n[3];
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_78;
    auVar446._8_8_ = 0;
    auVar446._0_8_ = local_a8.n[2];
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uStack_70;
    auVar447._8_8_ = 0;
    auVar447._0_8_ = local_a8.n[1];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = local_68;
    auVar448._8_8_ = 0;
    auVar448._0_8_ = local_a8.n[0];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uStack_60;
    auVar449._8_8_ = 0;
    auVar449._0_8_ = local_a8.n[4];
    uVar762 = SUB168(auVar105 * auVar449,0);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar102 * auVar446 + auVar101 * auVar445 + auVar103 * auVar447 + auVar104 * auVar448
               + auVar106 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    tmp2 = uVar765 & 0xfffffffffffff;
    auVar697._8_8_ = 0;
    auVar697._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = tmp1;
    auVar450._8_8_ = 0;
    auVar450._0_8_ = local_a8.n[4];
    auVar108._8_8_ = 0;
    auVar108._0_8_ = local_78;
    auVar451._8_8_ = 0;
    auVar451._0_8_ = local_a8.n[3];
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uStack_70;
    auVar452._8_8_ = 0;
    auVar452._0_8_ = local_a8.n[2];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_68;
    auVar453._8_8_ = 0;
    auVar453._0_8_ = local_a8.n[1];
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uStack_60;
    auVar454._8_8_ = 0;
    auVar454._0_8_ = local_a8.n[0];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar762 >> 0x34 | SUB168(auVar105 * auVar449,8) << 0xc;
    auVar162 = auVar107 * auVar450 + auVar697 + auVar108 * auVar451 + auVar109 * auVar452 +
               auVar110 * auVar453 + auVar111 * auVar454 + auVar112 * ZEXT816(0x1000003d10);
    uVar762 = auVar162._0_8_;
    auVar698._8_8_ = 0;
    auVar698._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    tmp3_2 = (uVar762 & 0xfffffffffffff) >> 0x30;
    r.n[0] = uVar762 & 0xffffffffffff;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = tmp1;
    auVar455._8_8_ = 0;
    auVar455._0_8_ = local_a8.n[0];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_78;
    auVar456._8_8_ = 0;
    auVar456._0_8_ = local_a8.n[4];
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_70;
    auVar457._8_8_ = 0;
    auVar457._0_8_ = local_a8.n[3];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_68;
    auVar458._8_8_ = 0;
    auVar458._0_8_ = local_a8.n[2];
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uStack_60;
    auVar459._8_8_ = 0;
    auVar459._0_8_ = local_a8.n[1];
    auVar162 = auVar114 * auVar456 + auVar698 + auVar115 * auVar457 + auVar116 * auVar458 +
               auVar117 * auVar459;
    uVar762 = auVar162._0_8_;
    auVar700._8_8_ = 0;
    auVar700._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar460._8_8_ = 0;
    auVar460._0_8_ = (uVar762 & 0xfffffffffffff) << 4 | tmp3_2;
    auVar162 = auVar113 * auVar455 + ZEXT816(0x1000003d1) * auVar460;
    uVar762 = auVar162._0_8_;
    local_1a8.n[0] = uVar762 & 0xfffffffffffff;
    auVar699._8_8_ = 0;
    auVar699._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = tmp1;
    auVar461._8_8_ = 0;
    auVar461._0_8_ = local_a8.n[1];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_78;
    auVar462._8_8_ = 0;
    auVar462._0_8_ = local_a8.n[0];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uStack_70;
    auVar463._8_8_ = 0;
    auVar463._0_8_ = local_a8.n[4];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = local_68;
    auVar464._8_8_ = 0;
    auVar464._0_8_ = local_a8.n[3];
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uStack_60;
    auVar465._8_8_ = 0;
    auVar465._0_8_ = local_a8.n[2];
    auVar163 = auVar120 * auVar463 + auVar700 + auVar121 * auVar464 + auVar122 * auVar465;
    uVar762 = auVar163._0_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar118 * auVar461 + auVar699 + auVar119 * auVar462 +
               auVar123 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    auVar702._8_8_ = 0;
    auVar702._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    local_1a8.n[1] = uVar765 & 0xfffffffffffff;
    auVar701._8_8_ = 0;
    auVar701._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = tmp1;
    auVar466._8_8_ = 0;
    auVar466._0_8_ = local_a8.n[2];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_78;
    auVar467._8_8_ = 0;
    auVar467._0_8_ = local_a8.n[1];
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_70;
    auVar468._8_8_ = 0;
    auVar468._0_8_ = local_a8.n[0];
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_68;
    auVar469._8_8_ = 0;
    auVar469._0_8_ = local_a8.n[4];
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_60;
    auVar470._8_8_ = 0;
    auVar470._0_8_ = local_a8.n[3];
    auVar163 = auVar127 * auVar469 + auVar702 + auVar128 * auVar470;
    uVar762 = auVar163._0_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar124 * auVar466 + auVar701 + auVar125 * auVar467 + auVar126 * auVar468 +
               auVar129 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    local_1a8.n[2] = uVar765 & 0xfffffffffffff;
    auVar703._8_8_ = 0;
    auVar703._0_8_ = (uVar765 >> 0x34 | auVar162._8_8_ << 0xc) + tmp2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar703 = auVar130 * ZEXT816(0x1000003d10) + auVar703;
    uVar762 = auVar703._0_8_;
    local_1a8.n[3] = uVar762 & 0xfffffffffffff;
    local_1a8.n[4] = (uVar762 >> 0x34 | auVar703._8_8_ << 0xc) + r.n[0];
    iVar760 = secp256k1_fe_impl_is_square_var(&local_1a8);
    if (iVar760 == 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var(&local_a8,&local_a8);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = tmp1;
    auVar471._8_8_ = 0;
    auVar471._0_8_ = local_a8.n[3];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = local_78;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = local_a8.n[2];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uStack_70;
    auVar473._8_8_ = 0;
    auVar473._0_8_ = local_a8.n[1];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_68;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = local_a8.n[0];
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uStack_60;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = local_a8.n[4];
    uVar762 = SUB168(auVar135 * auVar475,0);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar132 * auVar472 + auVar131 * auVar471 + auVar133 * auVar473 + auVar134 * auVar474
               + auVar136 * ZEXT816(0x1000003d10);
    uVar765 = auVar162._0_8_;
    auVar704._8_8_ = 0;
    auVar704._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = tmp1;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = local_a8.n[4];
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_78;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = local_a8.n[3];
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uStack_70;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = local_a8.n[2];
    auVar140._8_8_ = 0;
    auVar140._0_8_ = local_68;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = local_a8.n[1];
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uStack_60;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = local_a8.n[0];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar762 >> 0x34 | SUB168(auVar135 * auVar475,8) << 0xc;
    auVar162 = auVar137 * auVar476 + auVar704 + auVar138 * auVar477 + auVar139 * auVar478 +
               auVar140 * auVar479 + auVar141 * auVar480 + auVar142 * ZEXT816(0x1000003d10);
    uVar762 = auVar162._0_8_;
    auVar705._8_8_ = 0;
    auVar705._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    tmp3_2 = (uVar762 & 0xfffffffffffff) >> 0x30;
    r.n[0] = uVar762 & 0xffffffffffff;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = tmp1;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = local_a8.n[0];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = local_78;
    auVar482._8_8_ = 0;
    auVar482._0_8_ = local_a8.n[4];
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uStack_70;
    auVar483._8_8_ = 0;
    auVar483._0_8_ = local_a8.n[3];
    auVar146._8_8_ = 0;
    auVar146._0_8_ = local_68;
    auVar484._8_8_ = 0;
    auVar484._0_8_ = local_a8.n[2];
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uStack_60;
    auVar485._8_8_ = 0;
    auVar485._0_8_ = local_a8.n[1];
    auVar162 = auVar144 * auVar482 + auVar705 + auVar145 * auVar483 + auVar146 * auVar484 +
               auVar147 * auVar485;
    uVar762 = auVar162._0_8_;
    auVar707._8_8_ = 0;
    auVar707._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = (uVar762 & 0xfffffffffffff) << 4 | tmp3_2;
    uVar764 = auVar161._0_8_;
    auVar161 = auVar143 * auVar481 + ZEXT816(0x1000003d1) * auVar486;
    auVar706._8_8_ = 0;
    auVar706._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = tmp1;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = local_a8.n[1];
    auVar149._8_8_ = 0;
    auVar149._0_8_ = local_78;
    auVar488._8_8_ = 0;
    auVar488._0_8_ = local_a8.n[0];
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uStack_70;
    auVar489._8_8_ = 0;
    auVar489._0_8_ = local_a8.n[4];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_68;
    auVar490._8_8_ = 0;
    auVar490._0_8_ = local_a8.n[3];
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uStack_60;
    auVar491._8_8_ = 0;
    auVar491._0_8_ = local_a8.n[2];
    auVar163 = auVar150 * auVar489 + auVar707 + auVar151 * auVar490 + auVar152 * auVar491;
    uVar762 = auVar163._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar148 * auVar487 + auVar706 + auVar149 * auVar488 +
               auVar153 * ZEXT816(0x1000003d10);
    uVar766 = auVar162._0_8_;
    auVar709._8_8_ = 0;
    auVar709._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar708._8_8_ = 0;
    auVar708._0_8_ = uVar766 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = tmp1;
    auVar492._8_8_ = 0;
    auVar492._0_8_ = local_a8.n[2];
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_78;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = local_a8.n[1];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uStack_70;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = local_a8.n[0];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_68;
    auVar495._8_8_ = 0;
    auVar495._0_8_ = local_a8.n[4];
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uStack_60;
    auVar496._8_8_ = 0;
    auVar496._0_8_ = local_a8.n[3];
    auVar163 = auVar157 * auVar495 + auVar709 + auVar158 * auVar496;
    uVar762 = auVar163._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar762 & 0xfffffffffffff;
    auVar162 = auVar154 * auVar492 + auVar708 + auVar155 * auVar493 + auVar156 * auVar494 +
               auVar159 * ZEXT816(0x1000003d10);
    uVar769 = auVar162._0_8_;
    local_a8.n[2] = uVar769 & 0xfffffffffffff;
    auVar710._8_8_ = 0;
    auVar710._0_8_ = (uVar769 >> 0x34 | auVar162._8_8_ << 0xc) + (uVar765 & 0xfffffffffffff);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar762 >> 0x34 | auVar163._8_8_ << 0xc;
    auVar710 = auVar160 * ZEXT816(0x1000003d10) + auVar710;
    uVar762 = auVar710._0_8_;
    local_a8.n[3] = uVar762 & 0xfffffffffffff;
    local_a8.n[4] = (uVar762 >> 0x34 | auVar710._8_8_ << 0xc) + r.n[0];
    tmp2 = x.n[0];
    uStack_110 = x.n[1];
    local_108 = x.n[2];
    uStack_100 = x.n[3];
    local_f8 = x.n[4];
    local_a8.n[0] = uVar764 & 0xfffffffffffff;
    local_a8.n[1] = uVar766 & 0xfffffffffffff;
  }
  else {
    local_1a8.n[0] = 0x3ffffbfffff0bc - uVar768;
    local_1a8.n[1] = 0x3ffffffffffffc - uVar780;
    local_1a8.n[2] = 0x3ffffffffffffc - uVar781;
    local_1a8.n[3] = 0x3ffffffffffffc - uVar761;
    local_1a8.n[4] = 0x3fffffffffffc - uVar763;
    local_a8.n[0] = local_1a8.n[0] + x.n[0];
    local_a8.n[1] = local_1a8.n[1] + x.n[1];
    local_a8.n[2] = local_1a8.n[2] + x.n[2];
    local_a8.n[3] = local_1a8.n[3] + x.n[3];
    local_a8.n[4] = local_1a8.n[4] + x.n[4];
    iVar760 = secp256k1_fe_impl_is_square_var(&local_a8);
    if (iVar760 == 0) {
      return 0;
    }
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar768 * 2;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = uVar761;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar780 * 2;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = uVar781;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar763;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = uVar763;
    uVar765 = SUB168(auVar163 * auVar499,0);
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar765 & 0xfffffffffffff;
    auVar161 = auVar162 * auVar498 + auVar161 * auVar497 + auVar164 * ZEXT816(0x1000003d10);
    uVar766 = auVar161._0_8_;
    auVar711._8_8_ = 0;
    auVar711._0_8_ = uVar766 >> 0x34 | auVar161._8_8_ << 0xc;
    uVar762 = uVar763 * 2;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar768;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = uVar762;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar780 * 2;
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uVar761;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar781;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uVar781;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar765 >> 0x34 | SUB168(auVar163 * auVar499,8) << 0xc;
    auVar161 = auVar165 * auVar500 + auVar711 + auVar166 * auVar501 + auVar167 * auVar502 +
               auVar168 * ZEXT816(0x1000003d10);
    uVar769 = auVar161._0_8_;
    auVar712._8_8_ = 0;
    auVar712._0_8_ = uVar769 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar768;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = uVar768;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar780;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar762;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar781 * 2;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uVar761;
    auVar161 = auVar170 * auVar504 + auVar712 + auVar171 * auVar505;
    uVar765 = auVar161._0_8_;
    auVar714._8_8_ = 0;
    auVar714._0_8_ = uVar765 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = (uVar765 & 0xfffffffffffff) << 4 | (uVar769 & 0xfffffffffffff) >> 0x30;
    auVar161 = auVar169 * auVar503 + ZEXT816(0x1000003d1) * auVar506;
    uVar764 = auVar161._0_8_;
    uVar765 = uVar764 & 0xfffffffffffff;
    auVar713._8_8_ = 0;
    auVar713._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar768 * 2;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uVar780;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar781;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar762;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar761;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar761;
    auVar162 = auVar173 * auVar508 + auVar714 + auVar174 * auVar509;
    uVar764 = auVar162._0_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar764 & 0xfffffffffffff;
    auVar161 = auVar172 * auVar507 + auVar713 + auVar175 * ZEXT816(0x1000003d10);
    uVar770 = auVar161._0_8_;
    auVar716._8_8_ = 0;
    auVar716._0_8_ = uVar764 >> 0x34 | auVar162._8_8_ << 0xc;
    uVar764 = uVar770 & 0xfffffffffffff;
    auVar715._8_8_ = 0;
    auVar715._0_8_ = uVar770 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar768 * 2;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uVar781;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar780;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uVar780;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar761;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = uVar762;
    auVar716 = auVar178 * auVar512 + auVar716;
    uVar770 = auVar716._0_8_;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar770 & 0xfffffffffffff;
    auVar161 = auVar176 * auVar510 + auVar715 + auVar177 * auVar511 +
               auVar179 * ZEXT816(0x1000003d10);
    uVar771 = auVar161._0_8_;
    uVar762 = uVar771 & 0xfffffffffffff;
    auVar717._8_8_ = 0;
    auVar717._0_8_ = (uVar771 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar766 & 0xfffffffffffff);
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar770 >> 0x34 | auVar716._8_8_ << 0xc;
    auVar717 = auVar180 * ZEXT816(0x1000003d10) + auVar717;
    uVar770 = auVar717._0_8_;
    uVar766 = uVar770 & 0xfffffffffffff;
    uVar773 = (uVar770 >> 0x34 | auVar717._8_8_ << 0xc) + (uVar769 & 0xffffffffffff);
    auVar181._8_8_ = 0;
    auVar181._0_8_ = uVar765;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = local_a8.n[3];
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar764;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = local_a8.n[2];
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar762;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = local_a8.n[1];
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar766;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = local_a8.n[0];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar773;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = local_a8.n[4];
    uVar769 = SUB168(auVar185 * auVar517,0);
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar769 & 0xfffffffffffff;
    auVar161 = auVar182 * auVar514 + auVar181 * auVar513 + auVar183 * auVar515 + auVar184 * auVar516
               + auVar186 * ZEXT816(0x1000003d10);
    uVar770 = auVar161._0_8_;
    auVar718._8_8_ = 0;
    auVar718._0_8_ = uVar770 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar765;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = local_a8.n[4];
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar764;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = local_a8.n[3];
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar762;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = local_a8.n[2];
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar766;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = local_a8.n[1];
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar773;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = local_a8.n[0];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar769 >> 0x34 | SUB168(auVar185 * auVar517,8) << 0xc;
    auVar161 = auVar187 * auVar518 + auVar718 + auVar188 * auVar519 + auVar189 * auVar520 +
               auVar190 * auVar521 + auVar191 * auVar522 + auVar192 * ZEXT816(0x1000003d10);
    uVar771 = auVar161._0_8_;
    auVar719._8_8_ = 0;
    auVar719._0_8_ = uVar771 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar765;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = local_a8.n[0];
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar764;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = local_a8.n[4];
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar762;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = local_a8.n[3];
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar766;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = local_a8.n[2];
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar773;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = local_a8.n[1];
    auVar161 = auVar194 * auVar524 + auVar719 + auVar195 * auVar525 + auVar196 * auVar526 +
               auVar197 * auVar527;
    uVar769 = auVar161._0_8_;
    auVar721._8_8_ = 0;
    auVar721._0_8_ = uVar769 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = (uVar769 & 0xfffffffffffff) << 4 | (uVar771 & 0xfffffffffffff) >> 0x30;
    auVar161 = auVar193 * auVar523 + ZEXT816(0x1000003d1) * auVar528;
    uVar774 = auVar161._0_8_;
    auVar720._8_8_ = 0;
    auVar720._0_8_ = uVar774 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar765;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = local_a8.n[1];
    auVar199._8_8_ = 0;
    auVar199._0_8_ = uVar764;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = local_a8.n[0];
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar762;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = local_a8.n[4];
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar766;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = local_a8.n[3];
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar773;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = local_a8.n[2];
    auVar162 = auVar200 * auVar531 + auVar721 + auVar201 * auVar532 + auVar202 * auVar533;
    uVar769 = auVar162._0_8_;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar769 & 0xfffffffffffff;
    auVar161 = auVar198 * auVar529 + auVar720 + auVar199 * auVar530 +
               auVar203 * ZEXT816(0x1000003d10);
    uVar775 = auVar161._0_8_;
    auVar723._8_8_ = 0;
    auVar723._0_8_ = uVar769 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar722._8_8_ = 0;
    auVar722._0_8_ = uVar775 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar765;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = local_a8.n[2];
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar764;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = local_a8.n[1];
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar762;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = local_a8.n[0];
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar766;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = local_a8.n[4];
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar773;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = local_a8.n[3];
    auVar162 = auVar207 * auVar537 + auVar723 + auVar208 * auVar538;
    uVar769 = auVar162._0_8_;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar769 & 0xfffffffffffff;
    auVar161 = auVar204 * auVar534 + auVar722 + auVar205 * auVar535 + auVar206 * auVar536 +
               auVar209 * ZEXT816(0x1000003d10);
    uVar776 = auVar161._0_8_;
    auVar724._8_8_ = 0;
    auVar724._0_8_ = (uVar776 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar770 & 0xfffffffffffff);
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar769 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar724 = auVar210 * ZEXT816(0x1000003d10) + auVar724;
    uVar777 = auVar724._0_8_;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar768;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = uVar766;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar780;
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uVar762;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar781;
    auVar541._8_8_ = 0;
    auVar541._0_8_ = uVar764;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar761;
    auVar542._8_8_ = 0;
    auVar542._0_8_ = uVar765;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar763;
    auVar543._8_8_ = 0;
    auVar543._0_8_ = uVar773;
    uVar769 = SUB168(auVar215 * auVar543,0);
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar769 & 0xfffffffffffff;
    auVar161 = auVar212 * auVar540 + auVar211 * auVar539 + auVar213 * auVar541 + auVar214 * auVar542
               + auVar216 * ZEXT816(0x1000003d10);
    uVar770 = auVar161._0_8_;
    auVar725._8_8_ = 0;
    auVar725._0_8_ = uVar770 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uVar768;
    auVar544._8_8_ = 0;
    auVar544._0_8_ = uVar773;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uVar780;
    auVar545._8_8_ = 0;
    auVar545._0_8_ = uVar766;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar781;
    auVar546._8_8_ = 0;
    auVar546._0_8_ = uVar762;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar761;
    auVar547._8_8_ = 0;
    auVar547._0_8_ = uVar764;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar763;
    auVar548._8_8_ = 0;
    auVar548._0_8_ = uVar765;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar769 >> 0x34 | SUB168(auVar215 * auVar543,8) << 0xc;
    auVar161 = auVar217 * auVar544 + auVar725 + auVar218 * auVar545 + auVar219 * auVar546 +
               auVar220 * auVar547 + auVar221 * auVar548 + auVar222 * ZEXT816(0x1000003d10);
    uVar769 = auVar161._0_8_;
    auVar726._8_8_ = 0;
    auVar726._0_8_ = uVar769 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar768;
    auVar549._8_8_ = 0;
    auVar549._0_8_ = uVar765;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = uVar780;
    auVar550._8_8_ = 0;
    auVar550._0_8_ = uVar773;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar781;
    auVar551._8_8_ = 0;
    auVar551._0_8_ = uVar766;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar761;
    auVar552._8_8_ = 0;
    auVar552._0_8_ = uVar762;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar763;
    auVar553._8_8_ = 0;
    auVar553._0_8_ = uVar764;
    auVar161 = auVar224 * auVar550 + auVar726 + auVar225 * auVar551 + auVar226 * auVar552 +
               auVar227 * auVar553;
    uVar772 = auVar161._0_8_;
    auVar728._8_8_ = 0;
    auVar728._0_8_ = uVar772 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar554._8_8_ = 0;
    auVar554._0_8_ = (uVar772 & 0xfffffffffffff) << 4 | (uVar769 & 0xfffffffffffff) >> 0x30;
    auVar161 = auVar223 * auVar549 + ZEXT816(0x1000003d1) * auVar554;
    uVar778 = auVar161._0_8_;
    auVar727._8_8_ = 0;
    auVar727._0_8_ = uVar778 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar768;
    auVar555._8_8_ = 0;
    auVar555._0_8_ = uVar764;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar780;
    auVar556._8_8_ = 0;
    auVar556._0_8_ = uVar765;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar781;
    auVar557._8_8_ = 0;
    auVar557._0_8_ = uVar773;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar761;
    auVar558._8_8_ = 0;
    auVar558._0_8_ = uVar766;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar763;
    auVar559._8_8_ = 0;
    auVar559._0_8_ = uVar762;
    auVar162 = auVar230 * auVar557 + auVar728 + auVar231 * auVar558 + auVar232 * auVar559;
    uVar772 = auVar162._0_8_;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar772 & 0xfffffffffffff;
    auVar161 = auVar228 * auVar555 + auVar727 + auVar229 * auVar556 +
               auVar233 * ZEXT816(0x1000003d10);
    uVar779 = auVar161._0_8_;
    auVar730._8_8_ = 0;
    auVar730._0_8_ = uVar772 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar729._8_8_ = 0;
    auVar729._0_8_ = uVar779 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar768;
    auVar560._8_8_ = 0;
    auVar560._0_8_ = uVar762;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar780;
    auVar561._8_8_ = 0;
    auVar561._0_8_ = uVar764;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = uVar781;
    auVar562._8_8_ = 0;
    auVar562._0_8_ = uVar765;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar761;
    auVar563._8_8_ = 0;
    auVar563._0_8_ = uVar773;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar763;
    auVar564._8_8_ = 0;
    auVar564._0_8_ = uVar766;
    auVar162 = auVar237 * auVar563 + auVar730 + auVar238 * auVar564;
    uVar762 = auVar162._0_8_;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar762 & 0xfffffffffffff;
    auVar161 = auVar234 * auVar560 + auVar729 + auVar235 * auVar561 + auVar236 * auVar562 +
               auVar239 * ZEXT816(0x1000003d10);
    uVar765 = auVar161._0_8_;
    auVar731._8_8_ = 0;
    auVar731._0_8_ = (uVar765 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar770 & 0xfffffffffffff);
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar731 = auVar240 * ZEXT816(0x1000003d10) + auVar731;
    uVar764 = auVar731._0_8_;
    tmp1 = (uVar778 & 0xfffffffffffff) * 4 + 0x1c;
    uVar762 = (uVar774 & 0xfffffffffffff) * 3 + tmp1;
    local_78 = (uVar779 & 0xfffffffffffff) * 4;
    uStack_70 = (uVar765 & 0xfffffffffffff) * 4;
    uVar772 = (uVar775 & 0xfffffffffffff) * 3 + local_78;
    uVar773 = (uVar776 & 0xfffffffffffff) * 3 + uStack_70;
    local_68 = (uVar764 & 0xfffffffffffff) * 4;
    uStack_60 = ((uVar764 >> 0x34 | auVar731._8_8_ << 0xc) + (uVar769 & 0xffffffffffff)) * 4;
    uVar769 = local_68 + (uVar777 & 0xfffffffffffff) * 3;
    uVar770 = uStack_60 +
              ((uVar777 >> 0x34 | auVar724._8_8_ << 0xc) + (uVar771 & 0xffffffffffff)) * 3;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = local_a8.n[0];
    auVar565._8_8_ = 0;
    auVar565._0_8_ = uVar769;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = local_a8.n[1];
    auVar566._8_8_ = 0;
    auVar566._0_8_ = uVar773;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = local_a8.n[2];
    auVar567._8_8_ = 0;
    auVar567._0_8_ = uVar772;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = local_a8.n[3];
    auVar568._8_8_ = 0;
    auVar568._0_8_ = uVar762;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = local_a8.n[4];
    auVar569._8_8_ = 0;
    auVar569._0_8_ = uVar770;
    uVar765 = SUB168(auVar245 * auVar569,0);
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar765 & 0xfffffffffffff;
    auVar161 = auVar242 * auVar566 + auVar241 * auVar565 + auVar243 * auVar567 + auVar244 * auVar568
               + auVar246 * ZEXT816(0x1000003d10);
    uVar764 = auVar161._0_8_;
    tmp2 = uVar764 & 0xfffffffffffff;
    auVar732._8_8_ = 0;
    auVar732._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = local_a8.n[0];
    auVar570._8_8_ = 0;
    auVar570._0_8_ = uVar770;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = local_a8.n[1];
    auVar571._8_8_ = 0;
    auVar571._0_8_ = uVar769;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = local_a8.n[2];
    auVar572._8_8_ = 0;
    auVar572._0_8_ = uVar773;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = local_a8.n[3];
    auVar573._8_8_ = 0;
    auVar573._0_8_ = uVar772;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = local_a8.n[4];
    auVar574._8_8_ = 0;
    auVar574._0_8_ = uVar762;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uVar765 >> 0x34 | SUB168(auVar245 * auVar569,8) << 0xc;
    auVar161 = auVar247 * auVar570 + auVar732 + auVar248 * auVar571 + auVar249 * auVar572 +
               auVar250 * auVar573 + auVar251 * auVar574 + auVar252 * ZEXT816(0x1000003d10);
    uVar765 = auVar161._0_8_;
    auVar733._8_8_ = 0;
    auVar733._0_8_ = uVar765 >> 0x34 | auVar161._8_8_ << 0xc;
    r.n[0] = uVar765 & 0xffffffffffff;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = local_a8.n[0];
    auVar575._8_8_ = 0;
    auVar575._0_8_ = uVar762;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = local_a8.n[1];
    auVar576._8_8_ = 0;
    auVar576._0_8_ = uVar770;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = local_a8.n[2];
    auVar577._8_8_ = 0;
    auVar577._0_8_ = uVar769;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = local_a8.n[3];
    auVar578._8_8_ = 0;
    auVar578._0_8_ = uVar773;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = local_a8.n[4];
    auVar579._8_8_ = 0;
    auVar579._0_8_ = uVar772;
    auVar161 = auVar254 * auVar576 + auVar733 + auVar255 * auVar577 + auVar256 * auVar578 +
               auVar257 * auVar579;
    uVar764 = auVar161._0_8_;
    auVar735._8_8_ = 0;
    auVar735._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar580._8_8_ = 0;
    auVar580._0_8_ = (uVar764 & 0xfffffffffffff) << 4 | (uVar765 & 0xfffffffffffff) >> 0x30;
    auVar161 = auVar253 * auVar575 + ZEXT816(0x1000003d1) * auVar580;
    uVar764 = auVar161._0_8_;
    auVar734._8_8_ = 0;
    auVar734._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = local_a8.n[0];
    auVar581._8_8_ = 0;
    auVar581._0_8_ = uVar772;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = local_a8.n[1];
    auVar582._8_8_ = 0;
    auVar582._0_8_ = uVar762;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = local_a8.n[2];
    auVar583._8_8_ = 0;
    auVar583._0_8_ = uVar770;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = local_a8.n[3];
    auVar584._8_8_ = 0;
    auVar584._0_8_ = uVar769;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = local_a8.n[4];
    auVar585._8_8_ = 0;
    auVar585._0_8_ = uVar773;
    auVar162 = auVar260 * auVar583 + auVar735 + auVar261 * auVar584 + auVar262 * auVar585;
    uVar765 = auVar162._0_8_;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar765 & 0xfffffffffffff;
    auVar161 = auVar258 * auVar581 + auVar734 + auVar259 * auVar582 +
               auVar263 * ZEXT816(0x1000003d10);
    uVar766 = auVar161._0_8_;
    auVar737._8_8_ = 0;
    auVar737._0_8_ = uVar765 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar736._8_8_ = 0;
    auVar736._0_8_ = uVar766 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = local_a8.n[0];
    auVar586._8_8_ = 0;
    auVar586._0_8_ = uVar773;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = local_a8.n[1];
    auVar587._8_8_ = 0;
    auVar587._0_8_ = uVar772;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = local_a8.n[2];
    auVar588._8_8_ = 0;
    auVar588._0_8_ = uVar762;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = local_a8.n[3];
    auVar589._8_8_ = 0;
    auVar589._0_8_ = uVar770;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = local_a8.n[4];
    auVar590._8_8_ = 0;
    auVar590._0_8_ = uVar769;
    auVar162 = auVar267 * auVar589 + auVar737 + auVar268 * auVar590;
    uVar762 = auVar162._0_8_;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar762 & 0xfffffffffffff;
    auVar161 = auVar264 * auVar586 + auVar736 + auVar265 * auVar587 + auVar266 * auVar588 +
               auVar269 * ZEXT816(0x1000003d10);
    uVar765 = auVar161._0_8_;
    auVar738._8_8_ = 0;
    auVar738._0_8_ = (uVar765 >> 0x34 | auVar161._8_8_ << 0xc) + tmp2;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar738 = auVar270 * ZEXT816(0x1000003d10) + auVar738;
    uVar762 = auVar738._0_8_;
    tmp3_2 = 0x3ffffbfffff0bc - (uVar764 & 0xfffffffffffff);
    uStack_50 = 0x3ffffffffffffc - (uVar766 & 0xfffffffffffff);
    uStack_48 = 0x3ffffffffffffc - (uVar765 & 0xfffffffffffff);
    local_40 = 0x3ffffffffffffc - (uVar762 & 0xfffffffffffff);
    uStack_38 = 0x3fffffffffffc - ((uVar762 >> 0x34 | auVar738._8_8_ << 0xc) + r.n[0]);
    iVar760 = secp256k1_fe_impl_is_square_var((secp256k1_fe *)&tmp3_2);
    if ((iVar760 == 0) ||
       ((secp256k1_fe_sqrt(&r,(secp256k1_fe *)&tmp3_2), (c & 1U) != 0 &&
        (iVar760 = secp256k1_fe_impl_normalizes_to_zero_var(&r), iVar760 != 0)))) {
      return 0;
    }
    iVar760 = secp256k1_fe_impl_normalizes_to_zero_var(&local_a8);
    if (iVar760 != 0) {
      return 0;
    }
    secp256k1_fe_impl_inv_var((secp256k1_fe *)&tmp2,&local_a8);
    auVar271._8_8_ = 0;
    auVar271._0_8_ = r.n[0];
    auVar591._8_8_ = 0;
    auVar591._0_8_ = uStack_100;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = r.n[1];
    auVar592._8_8_ = 0;
    auVar592._0_8_ = local_108;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = r.n[2];
    auVar593._8_8_ = 0;
    auVar593._0_8_ = uStack_110;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = r.n[3];
    auVar594._8_8_ = 0;
    auVar594._0_8_ = tmp2;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = r.n[4];
    auVar595._8_8_ = 0;
    auVar595._0_8_ = local_f8;
    uVar762 = SUB168(auVar275 * auVar595,0);
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar762 & 0xfffffffffffff;
    auVar161 = auVar272 * auVar592 + auVar271 * auVar591 + auVar273 * auVar593 + auVar274 * auVar594
               + auVar276 * ZEXT816(0x1000003d10);
    uVar765 = auVar161._0_8_;
    auVar739._8_8_ = 0;
    auVar739._0_8_ = uVar765 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = r.n[0];
    auVar596._8_8_ = 0;
    auVar596._0_8_ = local_f8;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = r.n[1];
    auVar597._8_8_ = 0;
    auVar597._0_8_ = uStack_100;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = r.n[2];
    auVar598._8_8_ = 0;
    auVar598._0_8_ = local_108;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = r.n[3];
    auVar599._8_8_ = 0;
    auVar599._0_8_ = uStack_110;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = r.n[4];
    auVar600._8_8_ = 0;
    auVar600._0_8_ = tmp2;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = uVar762 >> 0x34 | SUB168(auVar275 * auVar595,8) << 0xc;
    auVar161 = auVar277 * auVar596 + auVar739 + auVar278 * auVar597 + auVar279 * auVar598 +
               auVar280 * auVar599 + auVar281 * auVar600 + auVar282 * ZEXT816(0x1000003d10);
    uVar762 = auVar161._0_8_;
    auVar740._8_8_ = 0;
    auVar740._0_8_ = uVar762 >> 0x34 | auVar161._8_8_ << 0xc;
    tmp3_6 = (uVar762 & 0xfffffffffffff) >> 0x30;
    tmp2_10 = uVar762 & 0xffffffffffff;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = r.n[0];
    auVar601._8_8_ = 0;
    auVar601._0_8_ = tmp2;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = r.n[1];
    auVar602._8_8_ = 0;
    auVar602._0_8_ = local_f8;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = r.n[2];
    auVar603._8_8_ = 0;
    auVar603._0_8_ = uStack_100;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = r.n[3];
    auVar604._8_8_ = 0;
    auVar604._0_8_ = local_108;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = r.n[4];
    auVar605._8_8_ = 0;
    auVar605._0_8_ = uStack_110;
    auVar161 = auVar284 * auVar602 + auVar740 + auVar285 * auVar603 + auVar286 * auVar604 +
               auVar287 * auVar605;
    uVar762 = auVar161._0_8_;
    auVar742._8_8_ = 0;
    auVar742._0_8_ = uVar762 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar606._8_8_ = 0;
    auVar606._0_8_ = (uVar762 & 0xfffffffffffff) << 4 | tmp3_6;
    auVar161 = auVar283 * auVar601 + ZEXT816(0x1000003d1) * auVar606;
    uVar764 = auVar161._0_8_;
    auVar741._8_8_ = 0;
    auVar741._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = r.n[0];
    auVar607._8_8_ = 0;
    auVar607._0_8_ = uStack_110;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = r.n[1];
    auVar608._8_8_ = 0;
    auVar608._0_8_ = tmp2;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = r.n[2];
    auVar609._8_8_ = 0;
    auVar609._0_8_ = local_f8;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = r.n[3];
    auVar610._8_8_ = 0;
    auVar610._0_8_ = uStack_100;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = r.n[4];
    auVar611._8_8_ = 0;
    auVar611._0_8_ = local_108;
    auVar162 = auVar290 * auVar609 + auVar742 + auVar291 * auVar610 + auVar292 * auVar611;
    uVar762 = auVar162._0_8_;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar762 & 0xfffffffffffff;
    auVar161 = auVar288 * auVar607 + auVar741 + auVar289 * auVar608 +
               auVar293 * ZEXT816(0x1000003d10);
    uVar766 = auVar161._0_8_;
    auVar744._8_8_ = 0;
    auVar744._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar743._8_8_ = 0;
    auVar743._0_8_ = uVar766 >> 0x34 | auVar161._8_8_ << 0xc;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = r.n[0];
    auVar612._8_8_ = 0;
    auVar612._0_8_ = local_108;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = r.n[1];
    auVar613._8_8_ = 0;
    auVar613._0_8_ = uStack_110;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = r.n[2];
    auVar614._8_8_ = 0;
    auVar614._0_8_ = tmp2;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = r.n[3];
    auVar615._8_8_ = 0;
    auVar615._0_8_ = local_f8;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = r.n[4];
    auVar616._8_8_ = 0;
    auVar616._0_8_ = uStack_100;
    auVar162 = auVar297 * auVar615 + auVar744 + auVar298 * auVar616;
    uVar762 = auVar162._0_8_;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar762 & 0xfffffffffffff;
    auVar161 = auVar294 * auVar612 + auVar743 + auVar295 * auVar613 + auVar296 * auVar614 +
               auVar299 * ZEXT816(0x1000003d10);
    uVar769 = auVar161._0_8_;
    auVar745._8_8_ = 0;
    auVar745._0_8_ = (uVar769 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar765 & 0xfffffffffffff);
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar762 >> 0x34 | auVar162._8_8_ << 0xc;
    auVar745 = auVar300 * ZEXT816(0x1000003d10) + auVar745;
    uVar770 = auVar745._0_8_;
    lVar782 = (uVar764 & 0xfffffffffffff) + local_1a8.n[0];
    uVar762 = -(ulong)((uint)lVar782 & 1);
    uVar771 = uVar762 >> 0xc;
    uVar766 = (uVar766 & 0xfffffffffffff) + local_1a8.n[1] + uVar771;
    uVar764 = (uVar769 & 0xfffffffffffff) + local_1a8.n[2] + uVar771;
    uVar765 = (uVar770 & 0xfffffffffffff) + local_1a8.n[3] + uVar771;
    local_f8 = (uVar762 >> 0x10) +
               (uVar770 >> 0x34 | auVar745._8_8_ << 0xc) + tmp2_10 + local_1a8.n[4];
    tmp2 = ((ulong)((uint)uVar766 & 1) << 0x33) + ((uVar771 & 0xffffefffffc2f) + lVar782 >> 1);
    uStack_110 = ((ulong)((uint)uVar764 & 1) << 0x33) + (uVar766 >> 1);
    local_108 = ((ulong)((uint)uVar765 & 1) << 0x33) + (uVar764 >> 1);
    uStack_100 = ((ulong)((uint)local_f8 & 1) << 0x33) + (uVar765 >> 1);
    local_f8 = local_f8 >> 1;
  }
  secp256k1_fe_sqrt(&local_1a8,&local_a8);
  if (((c & 5U) == 5) || ((c & 5U) == 0)) {
    local_1a8.n[0] = 0x3ffffbfffff0bc - local_1a8.n[0];
    local_1a8.n[1] = 0x3ffffffffffffc - local_1a8.n[1];
    local_1a8.n[2] = 0x3ffffffffffffc - local_1a8.n[2];
    local_1a8.n[3] = 0x3ffffffffffffc - local_1a8.n[3];
    local_1a8.n[4] = 0x3fffffffffffc - local_1a8.n[4];
  }
  psVar767 = &secp256k1_ellswift_c4;
  if ((c & 1U) == 0) {
    psVar767 = &secp256k1_ellswift_c3;
  }
  auVar301._8_8_ = 0;
  auVar301._0_8_ = psVar767->n[0];
  auVar617._8_8_ = 0;
  auVar617._0_8_ = uVar761;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = psVar767->n[1];
  auVar618._8_8_ = 0;
  auVar618._0_8_ = uVar781;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = psVar767->n[2];
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar780;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = psVar767->n[3];
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar768;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = psVar767->n[4];
  auVar621._8_8_ = 0;
  auVar621._0_8_ = uVar763;
  uVar762 = SUB168(auVar305 * auVar621,0);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar762 & 0xfffffffffffff;
  auVar161 = auVar302 * auVar618 + auVar301 * auVar617 + auVar303 * auVar619 + auVar304 * auVar620 +
             auVar306 * ZEXT816(0x1000003d10);
  uVar765 = auVar161._0_8_;
  auVar746._8_8_ = 0;
  auVar746._0_8_ = uVar765 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = psVar767->n[0];
  auVar622._8_8_ = 0;
  auVar622._0_8_ = uVar763;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = psVar767->n[1];
  auVar623._8_8_ = 0;
  auVar623._0_8_ = uVar761;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = psVar767->n[2];
  auVar624._8_8_ = 0;
  auVar624._0_8_ = uVar781;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = psVar767->n[3];
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar780;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = psVar767->n[4];
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar768;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar762 >> 0x34 | SUB168(auVar305 * auVar621,8) << 0xc;
  auVar161 = auVar307 * auVar622 + auVar746 + auVar308 * auVar623 + auVar309 * auVar624 +
             auVar310 * auVar625 + auVar311 * auVar626 + auVar312 * ZEXT816(0x1000003d10);
  uVar762 = auVar161._0_8_;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = uVar762 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = psVar767->n[0];
  auVar627._8_8_ = 0;
  auVar627._0_8_ = uVar768;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = psVar767->n[1];
  auVar628._8_8_ = 0;
  auVar628._0_8_ = uVar763;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = psVar767->n[2];
  auVar629._8_8_ = 0;
  auVar629._0_8_ = uVar761;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = psVar767->n[3];
  auVar630._8_8_ = 0;
  auVar630._0_8_ = uVar781;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = psVar767->n[4];
  auVar631._8_8_ = 0;
  auVar631._0_8_ = uVar780;
  auVar161 = auVar314 * auVar628 + auVar747 + auVar315 * auVar629 + auVar316 * auVar630 +
             auVar317 * auVar631;
  uVar764 = auVar161._0_8_;
  auVar749._8_8_ = 0;
  auVar749._0_8_ = uVar764 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = (uVar764 & 0xfffffffffffff) << 4 | (uVar762 & 0xfffffffffffff) >> 0x30;
  auVar161 = auVar313 * auVar627 + ZEXT816(0x1000003d1) * auVar632;
  uVar766 = auVar161._0_8_;
  auVar748._8_8_ = 0;
  auVar748._0_8_ = uVar766 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = psVar767->n[0];
  auVar633._8_8_ = 0;
  auVar633._0_8_ = uVar780;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = psVar767->n[1];
  auVar634._8_8_ = 0;
  auVar634._0_8_ = uVar768;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = psVar767->n[2];
  auVar635._8_8_ = 0;
  auVar635._0_8_ = uVar763;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = psVar767->n[3];
  auVar636._8_8_ = 0;
  auVar636._0_8_ = uVar761;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = psVar767->n[4];
  auVar637._8_8_ = 0;
  auVar637._0_8_ = uVar781;
  auVar162 = auVar320 * auVar635 + auVar749 + auVar321 * auVar636 + auVar322 * auVar637;
  uVar764 = auVar162._0_8_;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar764 & 0xfffffffffffff;
  auVar161 = auVar318 * auVar633 + auVar748 + auVar319 * auVar634 + auVar323 * ZEXT816(0x1000003d10)
  ;
  uVar769 = auVar161._0_8_;
  auVar751._8_8_ = 0;
  auVar751._0_8_ = uVar764 >> 0x34 | auVar162._8_8_ << 0xc;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = uVar769 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = psVar767->n[0];
  auVar638._8_8_ = 0;
  auVar638._0_8_ = uVar781;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = psVar767->n[1];
  auVar639._8_8_ = 0;
  auVar639._0_8_ = uVar780;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = psVar767->n[2];
  auVar640._8_8_ = 0;
  auVar640._0_8_ = uVar768;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = psVar767->n[3];
  auVar641._8_8_ = 0;
  auVar641._0_8_ = uVar763;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = psVar767->n[4];
  auVar642._8_8_ = 0;
  auVar642._0_8_ = uVar761;
  auVar162 = auVar327 * auVar641 + auVar751 + auVar328 * auVar642;
  uVar761 = auVar162._0_8_;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar761 & 0xfffffffffffff;
  auVar161 = auVar324 * auVar638 + auVar750 + auVar325 * auVar639 + auVar326 * auVar640 +
             auVar329 * ZEXT816(0x1000003d10);
  uVar763 = auVar161._0_8_;
  auVar752._8_8_ = 0;
  auVar752._0_8_ = (uVar763 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar765 & 0xfffffffffffff);
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar761 >> 0x34 | auVar162._8_8_ << 0xc;
  auVar752 = auVar330 * ZEXT816(0x1000003d10) + auVar752;
  uVar761 = auVar752._0_8_;
  uVar781 = (uVar766 & 0xfffffffffffff) + tmp2;
  uVar765 = (uVar769 & 0xfffffffffffff) + uStack_110;
  uVar764 = (uVar763 & 0xfffffffffffff) + local_108;
  uVar766 = (uVar761 & 0xfffffffffffff) + uStack_100;
  local_f8 = (uVar761 >> 0x34 | auVar752._8_8_ << 0xc) + (uVar762 & 0xffffffffffff) + local_f8;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar781;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = local_1a8.n[3];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar765;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = local_1a8.n[2];
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar764;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = local_1a8.n[1];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar766;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = local_1a8.n[0];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = local_f8;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = local_1a8.n[4];
  uVar761 = SUB168(auVar335 * auVar647,0);
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar761 & 0xfffffffffffff;
  auVar161 = auVar332 * auVar644 + auVar331 * auVar643 + auVar333 * auVar645 + auVar334 * auVar646 +
             auVar336 * ZEXT816(0x1000003d10);
  uVar763 = auVar161._0_8_;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = uVar763 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar781;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = local_1a8.n[4];
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar765;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = local_1a8.n[3];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar764;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = local_1a8.n[2];
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar766;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = local_1a8.n[1];
  auVar341._8_8_ = 0;
  auVar341._0_8_ = local_f8;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = local_1a8.n[0];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar761 >> 0x34 | SUB168(auVar335 * auVar647,8) << 0xc;
  auVar161 = auVar337 * auVar648 + auVar753 + auVar338 * auVar649 + auVar339 * auVar650 +
             auVar340 * auVar651 + auVar341 * auVar652 + auVar342 * ZEXT816(0x1000003d10);
  uVar761 = auVar161._0_8_;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = uVar761 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar781;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = local_1a8.n[0];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar765;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = local_1a8.n[4];
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar764;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = local_1a8.n[3];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar766;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = local_1a8.n[2];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = local_f8;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = local_1a8.n[1];
  auVar161 = auVar344 * auVar654 + auVar754 + auVar345 * auVar655 + auVar346 * auVar656 +
             auVar347 * auVar657;
  uVar768 = auVar161._0_8_;
  auVar756._8_8_ = 0;
  auVar756._0_8_ = uVar768 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = (uVar768 & 0xfffffffffffff) << 4 | (uVar761 & 0xfffffffffffff) >> 0x30;
  auVar161 = auVar343 * auVar653 + ZEXT816(0x1000003d1) * auVar658;
  uVar768 = auVar161._0_8_;
  local_e8->n[0] = uVar768 & 0xfffffffffffff;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = uVar768 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar781;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = local_1a8.n[1];
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar765;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = local_1a8.n[0];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar764;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = local_1a8.n[4];
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar766;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = local_1a8.n[3];
  auVar352._8_8_ = 0;
  auVar352._0_8_ = local_f8;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = local_1a8.n[2];
  auVar162 = auVar350 * auVar661 + auVar756 + auVar351 * auVar662 + auVar352 * auVar663;
  uVar768 = auVar162._0_8_;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar768 & 0xfffffffffffff;
  auVar161 = auVar348 * auVar659 + auVar755 + auVar349 * auVar660 + auVar353 * ZEXT816(0x1000003d10)
  ;
  uVar780 = auVar161._0_8_;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = uVar768 >> 0x34 | auVar162._8_8_ << 0xc;
  local_e8->n[1] = uVar780 & 0xfffffffffffff;
  auVar757._8_8_ = 0;
  auVar757._0_8_ = uVar780 >> 0x34 | auVar161._8_8_ << 0xc;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar781;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = local_1a8.n[2];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar765;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = local_1a8.n[1];
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar764;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = local_1a8.n[0];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar766;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = local_1a8.n[4];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_f8;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = local_1a8.n[3];
  auVar162 = auVar357 * auVar667 + auVar758 + auVar358 * auVar668;
  uVar768 = auVar162._0_8_;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar768 & 0xfffffffffffff;
  auVar161 = auVar354 * auVar664 + auVar757 + auVar355 * auVar665 + auVar356 * auVar666 +
             auVar359 * ZEXT816(0x1000003d10);
  uVar780 = auVar161._0_8_;
  local_e8->n[2] = uVar780 & 0xfffffffffffff;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = (uVar780 >> 0x34 | auVar161._8_8_ << 0xc) + (uVar763 & 0xfffffffffffff);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar768 >> 0x34 | auVar162._8_8_ << 0xc;
  auVar759 = auVar360 * ZEXT816(0x1000003d10) + auVar759;
  uVar763 = auVar759._0_8_;
  local_e8->n[3] = uVar763 & 0xfffffffffffff;
  local_e8->n[4] = (uVar763 >> 0x34 | auVar759._8_8_ << 0xc) + (uVar761 & 0xffffffffffff);
  return 1;
}

Assistant:

static int secp256k1_ellswift_xswiftec_inv_var(secp256k1_fe *t, const secp256k1_fe *x_in, const secp256k1_fe *u_in, int c) {
    /* The implemented algorithm is this (all arithmetic, except involving c, is mod p):
     *
     * - If (c & 2) = 0:
     *   - If (-x-u) is a valid X coordinate, fail.
     *   - Let s=-(u^3+7)/(u^2+u*x+x^2).
     *   - If s is not square, fail.
     *   - Let v=x.
     * - If (c & 2) = 2:
     *   - Let s=x-u.
     *   - If s is not square, fail.
     *   - Let r=sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist.
     *   - If (c & 1) = 1 and r = 0, fail.
     *   - If s=0, fail.
     *   - Let v=(r/s-u)/2.
     * - Let w=sqrt(s).
     * - If (c & 5) = 0: return -w*(c3*u + v).
     * - If (c & 5) = 1: return  w*(c4*u + v).
     * - If (c & 5) = 4: return  w*(c3*u + v).
     * - If (c & 5) = 5: return -w*(c4*u + v).
     */
    secp256k1_fe x = *x_in, u = *u_in, g, v, s, m, r, q;
    int ret;

    secp256k1_fe_normalize_weak(&x);
    secp256k1_fe_normalize_weak(&u);

#ifdef VERIFY
    VERIFY_CHECK(c >= 0 && c < 8);
    VERIFY_CHECK(secp256k1_ge_x_on_curve_var(&x));
#endif

    if (!(c & 2)) {
        /* c is in {0, 1, 4, 5}. In this case we look for an inverse under the x1 (if c=0 or
         * c=4) formula, or x2 (if c=1 or c=5) formula. */

        /* If -u-x is a valid X coordinate, fail. This would yield an encoding that roundtrips
         * back under the x3 formula instead (which has priority over x1 and x2, so the decoding
         * would not match x). */
        m = x;                                          /* m = x */
        secp256k1_fe_add(&m, &u);                       /* m = u+x */
        secp256k1_fe_negate(&m, &m, 2);                 /* m = -u-x */
        /* Test if (-u-x) is a valid X coordinate. If so, fail. */
        if (secp256k1_ge_x_on_curve_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [first part] */
        secp256k1_fe_sqr(&s, &m);                       /* s = (u+x)^2 */
        secp256k1_fe_negate(&s, &s, 1);                 /* s = -(u+x)^2 */
        secp256k1_fe_mul(&m, &u, &x);                   /* m = u*x */
        secp256k1_fe_add(&s, &m);                       /* s = -(u^2 + u*x + x^2) */

        /* Note that at this point, s = 0 is impossible. If it were the case:
         *             s = -(u^2 + u*x + x^2) = 0
         * =>                 u^2 + u*x + x^2 = 0
         * =>   (u + 2*x) * (u^2 + u*x + x^2) = 0
         * => 2*x^3 + 3*x^2*u + 3*x*u^2 + u^3 = 0
         * =>                 (x + u)^3 + x^3 = 0
         * =>                             x^3 = -(x + u)^3
         * =>                         x^3 + B = (-u - x)^3 + B
         *
         * However, we know x^3 + B is square (because x is on the curve) and
         * that (-u-x)^3 + B is not square (the secp256k1_ge_x_on_curve_var(&m)
         * test above would have failed). This is a contradiction, and thus the
         * assumption s=0 is false. */
#ifdef VERIFY
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(&s));
#endif

        /* If s is not square, fail. We have not fully computed s yet, but s is square iff
         * -(u^3+7)*(u^2+u*x+x^2) is square (because a/b is square iff a*b is square and b is
         * nonzero). */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_add_int(&g, SECP256K1_B);          /* g = u^3+7 */
        secp256k1_fe_mul(&m, &s, &g);                   /* m = -(u^3 + 7)*(u^2 + u*x + x^2) */
        if (!secp256k1_fe_is_square_var(&m)) return 0;

        /* Let s = -(u^3 + 7)/(u^2 + u*x + x^2) [second part] */
        secp256k1_fe_inv_var(&s, &s);                   /* s = -1/(u^2 + u*x + x^2) [no div by 0] */
        secp256k1_fe_mul(&s, &s, &g);                   /* s = -(u^3 + 7)/(u^2 + u*x + x^2) */

        /* Let v = x. */
        v = x;
    } else {
        /* c is in {2, 3, 6, 7}. In this case we look for an inverse under the x3 formula. */

        /* Let s = x-u. */
        secp256k1_fe_negate(&m, &u, 1);                 /* m = -u */
        s = m;                                          /* s = -u */
        secp256k1_fe_add(&s, &x);                       /* s = x-u */

        /* If s is not square, fail. */
        if (!secp256k1_fe_is_square_var(&s)) return 0;

        /* Let r = sqrt(-s*(4*(u^3+7)+3*u^2*s)); fail if it doesn't exist. */
        secp256k1_fe_sqr(&g, &u);                       /* g = u^2 */
        secp256k1_fe_mul(&q, &s, &g);                   /* q = s*u^2 */
        secp256k1_fe_mul_int(&q, 3);                    /* q = 3*s*u^2 */
        secp256k1_fe_mul(&g, &g, &u);                   /* g = u^3 */
        secp256k1_fe_mul_int(&g, 4);                    /* g = 4*u^3 */
        secp256k1_fe_add_int(&g, 4 * SECP256K1_B);      /* g = 4*(u^3+7) */
        secp256k1_fe_add(&q, &g);                       /* q = 4*(u^3+7)+3*s*u^2 */
        secp256k1_fe_mul(&q, &q, &s);                   /* q = s*(4*(u^3+7)+3*u^2*s) */
        secp256k1_fe_negate(&q, &q, 1);                 /* q = -s*(4*(u^3+7)+3*u^2*s) */
        if (!secp256k1_fe_is_square_var(&q)) return 0;
        ret = secp256k1_fe_sqrt(&r, &q);                /* r = sqrt(-s*(4*(u^3+7)+3*u^2*s)) */
        VERIFY_CHECK(ret);

        /* If (c & 1) = 1 and r = 0, fail. */
        if (EXPECT((c & 1) && secp256k1_fe_normalizes_to_zero_var(&r), 0)) return 0;

        /* If s = 0, fail. */
        if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&s), 0)) return 0;

        /* Let v = (r/s-u)/2. */
        secp256k1_fe_inv_var(&v, &s);                   /* v = 1/s [no div by 0] */
        secp256k1_fe_mul(&v, &v, &r);                   /* v = r/s */
        secp256k1_fe_add(&v, &m);                       /* v = r/s-u */
        secp256k1_fe_half(&v);                          /* v = (r/s-u)/2 */
    }

    /* Let w = sqrt(s). */
    ret = secp256k1_fe_sqrt(&m, &s);                    /* m = sqrt(s) = w */
    VERIFY_CHECK(ret);

    /* Return logic. */
    if ((c & 5) == 0 || (c & 5) == 5) {
        secp256k1_fe_negate(&m, &m, 1);                 /* m = -w */
    }
    /* Now m = {-w if c&5=0 or c&5=5; w otherwise}. */
    secp256k1_fe_mul(&u, &u, c&1 ? &secp256k1_ellswift_c4 : &secp256k1_ellswift_c3);
    /* u = {c4 if c&1=1; c3 otherwise}*u */
    secp256k1_fe_add(&u, &v);                           /* u = {c4 if c&1=1; c3 otherwise}*u + v */
    secp256k1_fe_mul(t, &m, &u);
    return 1;
}